

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O2

void Msat_OrderUpdate(Msat_Order_t *p,int Var)

{
  int i;
  abctime aVar1;
  abctime aVar2;
  
  aVar1 = Abc_Clock();
  if (((-1 < Var) && (Var < p->vIndex->nSize)) && (i = p->vIndex->pArray[(uint)Var], i != 0)) {
    Msat_HeapPercolateUp(p,i);
  }
  aVar2 = Abc_Clock();
  timeSelect = timeSelect + (aVar2 - aVar1);
  return;
}

Assistant:

void Msat_OrderUpdate( Msat_Order_t * p, int Var )
{
//    if (heap.inHeap(x))
//        heap.increase(x);

    abctime clk = Abc_Clock();
    if ( HINHEAP(p,Var) )
        Msat_HeapIncrease( p, Var );
timeSelect += Abc_Clock() - clk;
}